

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O0

void __thiscall QFbScreen::initializeCompositor(QFbScreen *this)

{
  QRect *in_RDI;
  long in_FS_OFFSET;
  QFbScreen *this_00;
  QSize local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QRect::size(in_RDI);
  this_00 = (QFbScreen *)&stack0xffffffffffffffe0;
  QImage::QImage((QImage *)this_00,&local_28,in_RDI[6].y1.m_i);
  QImage::operator=((QImage *)in_RDI,(QImage *)this_00);
  QImage::~QImage((QImage *)this_00);
  scheduleUpdate(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::initializeCompositor()
{
    mScreenImage = QImage(mGeometry.size(), mFormat);
    scheduleUpdate();
}